

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O2

void cplus::memory::testMemory_dark_magic(void)

{
  undefined1 uVar1;
  OutputStream *pOVar2;
  long lVar3;
  int constB;
  int constA;
  int b;
  int a;
  double d1;
  double constD2;
  double constD1;
  double d2;
  Test constTest2;
  Test constTest1;
  Test test1;
  Test test2;
  Test local_3f0;
  Test local_3c8;
  Test local_3a0;
  Test local_378;
  Test local_350;
  Test local_328;
  Test local_300;
  Test local_2d8;
  Test local_2b0;
  Test local_288;
  Test local_260;
  Test local_238;
  Test local_210;
  Test local_1e8;
  Test local_1c0;
  Test local_198;
  Test local_170;
  Test local_148;
  Test local_120;
  Test local_f8;
  Test local_d0;
  Test local_a8;
  Test local_80;
  Test local_58;
  
  constA = 1;
  constB = 2;
  d1 = 1.0;
  d2 = 2.0;
  constD1 = 1.0;
  constD2 = 2.0;
  test1.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  test1.d = 1.0;
  test1.constDouble = 1.0;
  test2.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  test2.d = 2.0;
  test2.constDouble = 2.0;
  constTest1.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  constTest1.d = 1.0;
  constTest1.constDouble = 1.0;
  constTest2.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  constTest2.d = 2.0;
  constTest2.constDouble = 2.0;
  b = constB;
  a = constA;
  constTest2.i = constB;
  constTest2.constI = constB;
  constTest1.i = constA;
  constTest1.constI = constA;
  test1.i = constA;
  test1.constI = constA;
  test2.i = constB;
  test2.constI = constB;
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"swap test:");
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1);
  pOVar2 = system::OutputStream::operator<<(pOVar2," b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    uVar1 = *(undefined1 *)((long)&b + lVar3);
    *(undefined1 *)((long)&b + lVar3) = *(undefined1 *)((long)&a + lVar3);
    *(undefined1 *)((long)&a + lVar3) = uVar1;
  }
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,a);
  pOVar2 = system::OutputStream::operator<<(pOVar2," b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,b);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  swap<int>(&a,&b);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,a);
  pOVar2 = system::OutputStream::operator<<(pOVar2," b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,b);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1.0);
  pOVar2 = system::OutputStream::operator<<(pOVar2," d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2.0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    uVar1 = *(undefined1 *)((long)&d2 + lVar3);
    *(undefined1 *)((long)&d2 + lVar3) = *(undefined1 *)((long)&d1 + lVar3);
    *(undefined1 *)((long)&d1 + lVar3) = uVar1;
  }
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,d1);
  pOVar2 = system::OutputStream::operator<<(pOVar2," d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,d2);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  swap<double>(&d1,&d2);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,d1);
  pOVar2 = system::OutputStream::operator<<(pOVar2," d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,d2);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1);
  pOVar2 = system::OutputStream::operator<<(pOVar2," const b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    uVar1 = *(undefined1 *)((long)&constB + lVar3);
    *(undefined1 *)((long)&constB + lVar3) = *(undefined1 *)((long)&constA + lVar3);
    *(undefined1 *)((long)&constA + lVar3) = uVar1;
  }
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1);
  pOVar2 = system::OutputStream::operator<<(pOVar2," const b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  swap<int>(&constA,&constB);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1);
  pOVar2 = system::OutputStream::operator<<(pOVar2," const b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1.0);
  pOVar2 = system::OutputStream::operator<<(pOVar2," const d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2.0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    uVar1 = *(undefined1 *)((long)&constD2 + lVar3);
    *(undefined1 *)((long)&constD2 + lVar3) = *(undefined1 *)((long)&constD1 + lVar3);
    *(undefined1 *)((long)&constD1 + lVar3) = uVar1;
  }
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1.0);
  pOVar2 = system::OutputStream::operator<<(pOVar2," d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2.0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  swap<double>(&constD1,&constD2);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,d1);
  pOVar2 = system::OutputStream::operator<<(pOVar2," d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2.0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"test1:");
  local_58.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_58._12_4_ = test1._12_4_;
  local_58.i = test1.i;
  local_58._28_4_ = test1._28_4_;
  local_58.constI = test1.constI;
  local_58.d = test1.d;
  local_58.constDouble = test1.constDouble;
  operator<<(pOVar2,&local_58);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"test2:");
  local_80.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_80._12_4_ = test2._12_4_;
  local_80.i = test2.i;
  local_80._28_4_ = test2._28_4_;
  local_80.constI = test2.constI;
  local_80.d = test2.d;
  local_80.constDouble = test2.constDouble;
  operator<<(pOVar2,&local_80);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  for (lVar3 = 0; lVar3 != 0x28; lVar3 = lVar3 + 1) {
    uVar1 = *(undefined1 *)((long)&test2.super_Object._vptr_Object + lVar3);
    *(undefined1 *)((long)&test2.super_Object._vptr_Object + lVar3) =
         *(undefined1 *)((long)&test1.super_Object._vptr_Object + lVar3);
    *(undefined1 *)((long)&test1.super_Object._vptr_Object + lVar3) = uVar1;
  }
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"test1:");
  local_a8.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_a8._12_4_ = test1._12_4_;
  local_a8.i = test1.i;
  local_a8._28_4_ = test1._28_4_;
  local_a8.constI = test1.constI;
  local_a8.d = test1.d;
  local_a8.constDouble = test1.constDouble;
  operator<<(pOVar2,&local_a8);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"test2:");
  local_d0.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_d0._12_4_ = test2._12_4_;
  local_d0.i = test2.i;
  local_d0._28_4_ = test2._28_4_;
  local_d0.constI = test2.constI;
  local_d0.d = test2.d;
  local_d0.constDouble = test2.constDouble;
  operator<<(pOVar2,&local_d0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  swap<cplus::memory::Test>(&test1,&test2);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"test1:");
  local_f8.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_f8._12_4_ = test1._12_4_;
  local_f8.i = test1.i;
  local_f8._28_4_ = test1._28_4_;
  local_f8.constI = test1.constI;
  local_f8.d = test1.d;
  local_f8.constDouble = test1.constDouble;
  operator<<(pOVar2,&local_f8);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"test2:");
  local_120.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_120._12_4_ = test2._12_4_;
  local_120.i = test2.i;
  local_120._28_4_ = test2._28_4_;
  local_120.constI = test2.constI;
  local_120.d = test2.d;
  local_120.constDouble = test2.constDouble;
  operator<<(pOVar2,&local_120);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const test1:");
  local_148.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_148._12_4_ = constTest1._12_4_;
  local_148.i = constTest1.i;
  local_148._28_4_ = constTest1._28_4_;
  local_148.constI = constTest1.constI;
  local_148.d = constTest1.d;
  local_148.constDouble = constTest1.constDouble;
  operator<<(pOVar2,&local_148);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"const test2:");
  local_170.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_170._12_4_ = constTest2._12_4_;
  local_170.i = constTest2.i;
  local_170._28_4_ = constTest2._28_4_;
  local_170.constI = constTest2.constI;
  local_170.d = constTest2.d;
  local_170.constDouble = constTest2.constDouble;
  operator<<(pOVar2,&local_170);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  for (lVar3 = 0; lVar3 != 0x28; lVar3 = lVar3 + 1) {
    uVar1 = *(undefined1 *)((long)&constTest2.super_Object._vptr_Object + lVar3);
    *(undefined1 *)((long)&constTest2.super_Object._vptr_Object + lVar3) =
         *(undefined1 *)((long)&constTest1.super_Object._vptr_Object + lVar3);
    *(undefined1 *)((long)&constTest1.super_Object._vptr_Object + lVar3) = uVar1;
  }
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const test1:");
  local_198.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_198._12_4_ = constTest1._12_4_;
  local_198.i = constTest1.i;
  local_198._28_4_ = constTest1._28_4_;
  local_198.constI = constTest1.constI;
  local_198.d = constTest1.d;
  local_198.constDouble = constTest1.constDouble;
  operator<<(pOVar2,&local_198);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"const test2:");
  local_1c0.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_1c0._12_4_ = constTest2._12_4_;
  local_1c0.i = constTest2.i;
  local_1c0._28_4_ = constTest2._28_4_;
  local_1c0.constI = constTest2.constI;
  local_1c0.d = constTest2.d;
  local_1c0.constDouble = constTest2.constDouble;
  operator<<(pOVar2,&local_1c0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  swap<cplus::memory::Test>(&constTest1,&constTest2);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const test1:");
  local_1e8.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_1e8._12_4_ = constTest1._12_4_;
  local_1e8.i = constTest1.i;
  local_1e8._28_4_ = constTest1._28_4_;
  local_1e8.constI = constTest1.constI;
  local_1e8.d = constTest1.d;
  local_1e8.constDouble = constTest1.constDouble;
  operator<<(pOVar2,&local_1e8);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"const test2:");
  local_210.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_210._12_4_ = constTest2._12_4_;
  local_210.i = constTest2.i;
  local_210._28_4_ = constTest2._28_4_;
  local_210.constI = constTest2.constI;
  local_210.d = constTest2.d;
  local_210.constDouble = constTest2.constDouble;
  operator<<(pOVar2,&local_210);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"copy test:");
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,a);
  pOVar2 = system::OutputStream::operator<<(pOVar2," b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,b);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    *(undefined1 *)((long)&b + lVar3) = *(undefined1 *)((long)&a + lVar3);
  }
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,a);
  pOVar2 = system::OutputStream::operator<<(pOVar2," b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,b);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  copy<int>(&a,&b);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,a);
  pOVar2 = system::OutputStream::operator<<(pOVar2," b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,b);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,d1);
  pOVar2 = system::OutputStream::operator<<(pOVar2," d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,d2);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    *(undefined1 *)((long)&d2 + lVar3) = *(undefined1 *)((long)&d1 + lVar3);
  }
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,d1);
  pOVar2 = system::OutputStream::operator<<(pOVar2," d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,d2);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  copy<double>(&d1,&d2);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,d1);
  pOVar2 = system::OutputStream::operator<<(pOVar2," d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,d2);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1);
  pOVar2 = system::OutputStream::operator<<(pOVar2," const b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    uVar1 = *(undefined1 *)((long)&constB + lVar3);
    *(undefined1 *)((long)&constB + lVar3) = *(undefined1 *)((long)&constA + lVar3);
    *(undefined1 *)((long)&constA + lVar3) = uVar1;
  }
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1);
  pOVar2 = system::OutputStream::operator<<(pOVar2," const b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  swap<int>(&constA,&constB);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1);
  pOVar2 = system::OutputStream::operator<<(pOVar2," const b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1.0);
  pOVar2 = system::OutputStream::operator<<(pOVar2," const d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2.0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    uVar1 = *(undefined1 *)((long)&constD2 + lVar3);
    *(undefined1 *)((long)&constD2 + lVar3) = *(undefined1 *)((long)&constD1 + lVar3);
    *(undefined1 *)((long)&constD1 + lVar3) = uVar1;
  }
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1.0);
  pOVar2 = system::OutputStream::operator<<(pOVar2," d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2.0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  swap<double>(&constD1,&constD2);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,d1);
  pOVar2 = system::OutputStream::operator<<(pOVar2," d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2.0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"test1:");
  local_238.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_238._12_4_ = test1._12_4_;
  local_238.i = test1.i;
  local_238._28_4_ = test1._28_4_;
  local_238.constI = test1.constI;
  local_238.d = test1.d;
  local_238.constDouble = test1.constDouble;
  operator<<(pOVar2,&local_238);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"test2:");
  local_260.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_260._12_4_ = test2._12_4_;
  local_260.i = test2.i;
  local_260._28_4_ = test2._28_4_;
  local_260.constI = test2.constI;
  local_260.d = test2.d;
  local_260.constDouble = test2.constDouble;
  operator<<(pOVar2,&local_260);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  for (lVar3 = 0; lVar3 != 0x28; lVar3 = lVar3 + 1) {
    *(undefined1 *)((long)&test2.super_Object._vptr_Object + lVar3) =
         *(undefined1 *)((long)&test1.super_Object._vptr_Object + lVar3);
  }
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"test1:");
  local_288.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_288._12_4_ = test1._12_4_;
  local_288.i = test1.i;
  local_288._28_4_ = test1._28_4_;
  local_288.constI = test1.constI;
  local_288.d = test1.d;
  local_288.constDouble = test1.constDouble;
  operator<<(pOVar2,&local_288);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"test2:");
  local_2b0.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_2b0._12_4_ = test2._12_4_;
  local_2b0.i = test2.i;
  local_2b0._28_4_ = test2._28_4_;
  local_2b0.constI = test2.constI;
  local_2b0.d = test2.d;
  local_2b0.constDouble = test2.constDouble;
  operator<<(pOVar2,&local_2b0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  copy<cplus::memory::Test>(&test1,&test2);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"test1:");
  local_2d8.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_2d8._12_4_ = test1._12_4_;
  local_2d8.i = test1.i;
  local_2d8._28_4_ = test1._28_4_;
  local_2d8.constI = test1.constI;
  local_2d8.d = test1.d;
  local_2d8.constDouble = test1.constDouble;
  operator<<(pOVar2,&local_2d8);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"test2:");
  local_300.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_300._12_4_ = test2._12_4_;
  local_300.i = test2.i;
  local_300._28_4_ = test2._28_4_;
  local_300.constI = test2.constI;
  local_300.d = test2.d;
  local_300.constDouble = test2.constDouble;
  operator<<(pOVar2,&local_300);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const test1:");
  local_328.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_328._12_4_ = constTest1._12_4_;
  local_328.i = constTest1.i;
  local_328._28_4_ = constTest1._28_4_;
  local_328.constI = constTest1.constI;
  local_328.d = constTest1.d;
  local_328.constDouble = constTest1.constDouble;
  operator<<(pOVar2,&local_328);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"const test2:");
  local_350.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_350._12_4_ = constTest2._12_4_;
  local_350.i = constTest2.i;
  local_350._28_4_ = constTest2._28_4_;
  local_350.constI = constTest2.constI;
  local_350.d = constTest2.d;
  local_350.constDouble = constTest2.constDouble;
  operator<<(pOVar2,&local_350);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  for (lVar3 = 0; lVar3 != 0x28; lVar3 = lVar3 + 1) {
    *(undefined1 *)((long)&constTest2.super_Object._vptr_Object + lVar3) =
         *(undefined1 *)((long)&constTest1.super_Object._vptr_Object + lVar3);
  }
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const test1:");
  local_378.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_378._12_4_ = constTest1._12_4_;
  local_378.i = constTest1.i;
  local_378._28_4_ = constTest1._28_4_;
  local_378.constI = constTest1.constI;
  local_378.d = constTest1.d;
  local_378.constDouble = constTest1.constDouble;
  operator<<(pOVar2,&local_378);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"const test2:");
  local_3a0.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_3a0._12_4_ = constTest2._12_4_;
  local_3a0.i = constTest2.i;
  local_3a0._28_4_ = constTest2._28_4_;
  local_3a0.constI = constTest2.constI;
  local_3a0.d = constTest2.d;
  local_3a0.constDouble = constTest2.constDouble;
  operator<<(pOVar2,&local_3a0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  copy<cplus::memory::Test>(&constTest1,&constTest2);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const test1:");
  local_3c8.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_3c8._12_4_ = constTest1._12_4_;
  local_3c8.i = constTest1.i;
  local_3c8._28_4_ = constTest1._28_4_;
  local_3c8.constI = constTest1.constI;
  local_3c8.d = constTest1.d;
  local_3c8.constDouble = constTest1.constDouble;
  operator<<(pOVar2,&local_3c8);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"const test2:");
  local_3f0.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128ae0;
  local_3f0._12_4_ = constTest2._12_4_;
  local_3f0.i = constTest2.i;
  local_3f0._28_4_ = constTest2._28_4_;
  local_3f0.constI = constTest2.constI;
  local_3f0.d = constTest2.d;
  local_3f0.constDouble = constTest2.constDouble;
  operator<<(pOVar2,&local_3f0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  return;
}

Assistant:

void testMemory_dark_magic() {
			/**
			 * 定义测试用变量
			 */
			int a = 1, b = 2;
			double d1 = 1.0;
			double d2 = 2.0;
			const int constA = 1, constB = 2;
			const double constD1 = 1.0, constD2 = 2.0;
			Test test1(1, 1, 1, 1), test2(2, 2, 2, 2);
			const Test constTest1(1, 1, 1, 1), constTest2(2, 2, 2, 2);
			/**
			 * swap test start
			 */
			//提示开始swap方法测试
			sout << "swap test:" << endl;
			//输出测试前变量的状态
			sout << "a:" << a << " b:" << b << endl;
			//测试非const变量的__SWAP宏
			__SWAP(a, b)
			sout << "a:" << a << " b:" << b << endl;
			//测试非const变量的swap函数
			::cplus::memory::swap(a, b);
			sout << "a:" << a << " b:" << b << endl;
			
			//输出测试前变量的状态
			sout << "d1:" << d1 << " d2:" << d2 << endl;
			//测试非const变量的__SWAP宏
			__SWAP(d1, d2)
			sout << "d1:" << d1 << " d2:" << d2 << endl;
			//测试非const变量的swap函数
			::cplus::memory::swap(d1, d2);
			sout << "d1:" << d1 << " d2:" << d2 << endl;
			
			//输出测试前变量的状态
			sout << "const a:" << constA << " const b:" << constB << endl;
			//测试const变量的__SWAP宏
			__SWAP(constA, constB)
			sout << "const a:" << constA << " const b:" << constB << endl;
			//测试const变量的swap函数
			::cplus::memory::swap(constA, constB);
			sout << "const a:" << constA << " const b:" << constB << endl;
			
			//输出测试前变量的状态
			sout << "const d1:" << constD1 << " const d2:" << constD2 << endl;
			//测试const变量的__SWAP宏
			__SWAP(constD1, constD2)
			sout << "d1:" << constD1 << " d2:" << constD2 << endl;
			//测试const变量的swap函数
			::cplus::memory::swap(constD1, constD2);
			sout << "d1:" << d1 << " d2:" << constD2 << endl;
			
			//输出测试前变量的状态
			sout << "test1:" << test1 << endl << "test2:" << test2 << endl;
			//测试非const变量的__SWAP宏
			__SWAP(test1, test2)
			sout << "test1:" << test1 << endl << "test2:" << test2 << endl;
			//测试非const变量的swap函数
			::cplus::memory::swap(test1, test2);
			sout << "test1:" << test1 << endl << "test2:" << test2 << endl;
			
			//输出测试前变量的状态
			sout << "const test1:" << constTest1 << endl << "const test2:" << constTest2 << endl;
			//测试const变量的__SWAP宏
			__SWAP(constTest1, constTest2)
			sout << "const test1:" << constTest1 << endl << "const test2:" << constTest2 << endl;
			//测试const变量的swap函数
			::cplus::memory::swap(constTest1, constTest2);
			sout << "const test1:" << constTest1 << endl << "const test2:" << constTest2 << endl;
			/**
			 * swap test end
			 */
			
			/**
			 * copy test start
			 */
			//提示开始copy方法测试
			sout << endl << "copy test:" << endl;
			
			//输出测试前变量的状态
			sout << "a:" << a << " b:" << b << endl;
			//测试非const变量的__COPY宏
			__COPY(a, b)
			sout << "a:" << a << " b:" << b << endl;
			//测试非const变量的copy函数
			::cplus::memory::copy(a, b);
			sout << "a:" << a << " b:" << b << endl;
			
			//输出测试前变量的状态
			sout << "d1:" << d1 << " d2:" << d2 << endl;
			//测试非const变量的__COPY宏
			__COPY(d1, d2)
			sout << "d1:" << d1 << " d2:" << d2 << endl;
			//测试非const变量的copy函数
			::cplus::memory::copy(d1, d2);
			sout << "d1:" << d1 << " d2:" << d2 << endl;
			
			
			//输出测试前变量的状态
			sout << "const a:" << constA << " const b:" << constB << endl;
			//测试const变量的__COPY宏
			__SWAP(constA, constB)
			sout << "const a:" << constA << " const b:" << constB << endl;
			//测试const变量的copy函数
			::cplus::memory::swap(constA, constB);
			sout << "const a:" << constA << " const b:" << constB << endl;
			
			//输出测试前变量的状态
			sout << "const d1:" << constD1 << " const d2:" << constD2 << endl;
			//测试const变量的__COPY宏
			__SWAP(constD1, constD2)
			sout << "d1:" << constD1 << " d2:" << constD2 << endl;
			//测试const变量的copy函数
			::cplus::memory::swap(constD1, constD2);
			sout << "d1:" << d1 << " d2:" << constD2 << endl;
			
			//输出测试前变量的状态
			sout << "test1:" << test1 << endl << "test2:" << test2 << endl;
			//测试非const变量的__COPY宏
			__COPY(test1, test2)
			sout << "test1:" << test1 << endl << "test2:" << test2 << endl;
			//测试非const变量的copy函数
			::cplus::memory::copy(test1, test2);
			sout << "test1:" << test1 << endl << "test2:" << test2 << endl;
			
			//输出测试前变量的状态
			sout << "const test1:" << constTest1 << endl << "const test2:" << constTest2 << endl;
			//测试const变量的__COPY宏
			__COPY(constTest1, constTest2)
			sout << "const test1:" << constTest1 << endl << "const test2:" << constTest2 << endl;
			//测试const变量的copy函数
			::cplus::memory::copy(constTest1, constTest2);
			sout << "const test1:" << constTest1 << endl << "const test2:" << constTest2 << endl;
			/**
			 * copy test end
			 */
		}